

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetime_impl.hpp
# Opt level: O3

ostream * toml::operator<<(ostream *os,local_date *date)

{
  ostream *poVar1;
  long lVar2;
  char local_1a [2];
  
  lVar2 = *(long *)os;
  poVar1 = os + *(long *)(lVar2 + -0x18);
  if (os[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar1);
    poVar1[0xe1] = (ostream)0x1;
    lVar2 = *(long *)os;
  }
  poVar1[0xe0] = (ostream)0x30;
  *(undefined8 *)(os + *(long *)(lVar2 + -0x18) + 0x10) = 4;
  poVar1 = (ostream *)std::ostream::operator<<(os,(int)date->year);
  local_1a[0] = '-';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1a,1);
  lVar2 = *(long *)os;
  poVar1 = os + *(long *)(lVar2 + -0x18);
  if (os[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar1);
    poVar1[0xe1] = (ostream)0x1;
    lVar2 = *(long *)os;
  }
  poVar1[0xe0] = (ostream)0x30;
  *(undefined8 *)(os + *(long *)(lVar2 + -0x18) + 0x10) = 2;
  poVar1 = (ostream *)std::ostream::operator<<(os,date->month + 1);
  local_1a[1] = 0x2d;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1a + 1,1);
  lVar2 = *(long *)os;
  poVar1 = os + *(long *)(lVar2 + -0x18);
  if (os[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar1);
    poVar1[0xe1] = (ostream)0x1;
    lVar2 = *(long *)os;
  }
  poVar1[0xe0] = (ostream)0x30;
  *(undefined8 *)(os + *(long *)(lVar2 + -0x18) + 0x10) = 2;
  std::ostream::operator<<(os,(uint)date->day);
  return os;
}

Assistant:

TOML11_INLINE std::ostream& operator<<(std::ostream& os, const local_date& date)
{
    os << std::setfill('0') << std::setw(4) << static_cast<int>(date.year )     << '-';
    os << std::setfill('0') << std::setw(2) << static_cast<int>(date.month) + 1 << '-';
    os << std::setfill('0') << std::setw(2) << static_cast<int>(date.day  )    ;
    return os;
}